

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

void cpptrace::rethrow_and_wrap_if_needed(size_t skip)

{
  undefined8 uVar1;
  nested_exception *this;
  undefined1 auVar2 [12];
  exception_ptr local_48;
  long local_40;
  raw_trace local_38;
  
  std::current_exception();
  auVar2 = std::rethrow_exception((exception_ptr)&local_40);
  if (local_40 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  __cxa_begin_catch(auVar2._0_8_);
  if (auVar2._8_4_ != 2) {
    this = (nested_exception *)__cxa_allocate_exception(0x70);
    std::current_exception();
    detail::get_raw_trace_and_absorb(&local_38,skip + 1);
    nested_exception::nested_exception(this,&local_48,&local_38);
    __cxa_throw(this,&nested_exception::typeinfo,nested_exception::~nested_exception);
  }
  uVar1 = __cxa_rethrow();
  if (local_38.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.frames.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.frames.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.frames.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    void rethrow_and_wrap_if_needed(std::size_t skip) {
        try {
            std::rethrow_exception(std::current_exception());
        } catch(cpptrace::exception&) {
            throw; // already a cpptrace::exception
        } catch(...) {
            throw nested_exception(std::current_exception(), detail::get_raw_trace_and_absorb(skip + 1));
        }
    }